

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O1

string * __thiscall
BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_BnB_Node *this,
          BayesianGameIdenticalPayoffInterface *bgip,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jtIndexMapping)

{
  Index jTypeI;
  ulong uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  uint uVar4;
  ulong uVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_depth != 0) {
    uVar1 = 0;
    do {
      jTypeI = (jtIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar1];
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tjt=",4);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," [",2);
      pvVar3 = BayesianGameBase::JointToIndividualTypeIndices(&bgip->super_BayesianGameBase,jTypeI);
      if ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (",2);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"->",2);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
        } while ((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2 != uVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      uVar4 = (int)uVar1 + 1;
      uVar1 = (ulong)uVar4;
    } while (uVar4 != this->_m_depth);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy(
    BayesianGameIdenticalPayoffInterface *bgip,
    const vector<Index> & jtIndexMapping

        ) const
{
    std::stringstream ss;
#if 1
    for(Index jt_oI=0;jt_oI!=_m_depth;++jt_oI)
    {
        Index jt;
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_jtIndexMapping)
            jt=(*_m_jtIndexMapping)[jt_oI];
        else
#endif
            jt=jtIndexMapping[jt_oI];
        ss << "\tjt=" << jt << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices( jt );
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\n";
    }
#else
    for(Index jt=0;jt!=_m_depth;++jt)
    {
        ss << "jt " << _m_jtIndexMapping[jt] << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices(
                _m_jtIndexMapping[jt]);
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\t";
    }
#endif
    return(ss.str());
}